

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

ES5HeapArgumentsObject * __thiscall
Js::HeapArgumentsObject::ConvertToES5HeapArgumentsObject
          (HeapArgumentsObject *this,bool overwriteArgsUsingFrameObject)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  DynamicObject *this_00;
  Var value;
  uint local_24;
  uint32 i;
  ES5HeapArgumentsObject *es5This;
  bool overwriteArgsUsingFrameObject_local;
  HeapArgumentsObject *this_local;
  
  BVar3 = CrossSite::IsCrossSiteObjectTyped<Js::HeapArgumentsObject>(this);
  if (BVar3 == 0) {
    bVar2 = VirtualTableInfo<Js::HeapArgumentsObject>::HasVirtualTable(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                  ,0x122,
                                  "(VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this))",
                                  "VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    VirtualTableInfo<Js::ES5HeapArgumentsObject>::SetVirtualTable(this);
  }
  else {
    bVar2 = VirtualTableInfo<Js::CrossSiteObject<Js::HeapArgumentsObject>_>::HasVirtualTable(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                  ,0x127,
                                  "(VirtualTableInfo<CrossSiteObject<HeapArgumentsObject>>::HasVirtualTable(this))"
                                  ,
                                  "VirtualTableInfo<CrossSiteObject<HeapArgumentsObject>>::HasVirtualTable(this)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    VirtualTableInfo<Js::CrossSiteObject<Js::ES5HeapArgumentsObject>_>::SetVirtualTable(this);
  }
  if (overwriteArgsUsingFrameObject) {
    local_24 = 0;
    while( true ) {
      bVar2 = false;
      if (local_24 < this->formalCount) {
        bVar2 = local_24 < (*(uint *)&this->field_0x20 & 0x7fffffff);
      }
      if (!bVar2) break;
      BVar3 = IsFormalArgument(this,local_24);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                    ,0x133,"(this->IsFormalArgument(i))","this->IsFormalArgument(i)"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      BVar3 = IsArgumentDeleted(this,local_24);
      if (BVar3 == 0) {
        this_00 = &Memory::WriteBarrierPtr<Js::ActivationObject>::operator->(&this->frameObject)->
                   super_DynamicObject;
        value = DynamicObject::GetSlot(this_00,local_24);
        DynamicObject::SetObjectArrayItem
                  ((DynamicObject *)this,local_24,value,PropertyOperation_None);
      }
      local_24 = local_24 + 1;
    }
  }
  return (ES5HeapArgumentsObject *)this;
}

Assistant:

ES5HeapArgumentsObject* HeapArgumentsObject::ConvertToES5HeapArgumentsObject(bool overwriteArgsUsingFrameObject)
    {
        if (!CrossSite::IsCrossSiteObjectTyped(this))
        {
            Assert(VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this));
            VirtualTableInfo<ES5HeapArgumentsObject>::SetVirtualTable(this);
        }
        else
        {
            Assert(VirtualTableInfo<CrossSiteObject<HeapArgumentsObject>>::HasVirtualTable(this));
            VirtualTableInfo<CrossSiteObject<ES5HeapArgumentsObject>>::SetVirtualTable(this);
        }

        ES5HeapArgumentsObject* es5This = static_cast<ES5HeapArgumentsObject*>(this);

        if (overwriteArgsUsingFrameObject)
        {
            // Copy existing items to the array so that they are there before the user can call Object.preventExtensions,
            // after which we can no longer add new items to the objectArray.
            for (uint32 i = 0; i < this->formalCount && i < this->numOfArguments; ++i)
            {
                AssertMsg(this->IsFormalArgument(i), "this->IsFormalArgument(i)");
                if (!this->IsArgumentDeleted(i))
                {
                    // At this time the value doesn't matter, use one from slots.
                    this->SetObjectArrayItem(i, this->frameObject->GetSlot(i), PropertyOperation_None);
                }
            }
        }
        return es5This;

    }